

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_details::rrb_drop_right<char,false,5>
          (rrb_details *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t right)

{
  int *piVar1;
  uint32_t uVar2;
  rrb<char,_false,_5> *prVar3;
  leaf_node<char,_false> *plVar4;
  uint32_t *puVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  tree_node<char,_false> *ptVar9;
  uint uVar10;
  undefined8 *puVar11;
  uint32_t i;
  ulong uVar12;
  char *__function;
  uint uVar13;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb_details::tree_node<char,_false>_> root;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_40;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  ulong uVar14;
  
  if (right == 0) {
    puVar11 = (undefined8 *)malloc(0x28);
    *puVar11 = 0;
    *(undefined4 *)(puVar11 + 1) = 0;
    puVar11[2] = 0;
    puVar11[3] = 0;
    local_40.ptr = (leaf_node<char,_false> *)malloc(0x18);
    (local_40.ptr)->child = (char *)0x0;
    (local_40.ptr)->type = LEAF_NODE;
    (local_40.ptr)->len = 0;
    (local_40.ptr)->_ref_count = 1;
    (local_40.ptr)->guid = 0;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar11 + 2),&local_40);
    if ((local_40.ptr != (leaf_node<char,_false> *)0x0) &&
       (uVar2 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_40.ptr);
    }
    *(undefined8 **)this = puVar11;
    *(undefined4 *)(puVar11 + 4) = 1;
    return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
  }
  prVar3 = in->ptr;
  if (prVar3 != (rrb<char,_false,_5> *)0x0) {
    if (prVar3->cnt <= right) {
      *(rrb<char,_false,_5> **)this = prVar3;
      prVar3->_ref_count = prVar3->_ref_count + 1;
      return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
    }
    uVar10 = prVar3->cnt - prVar3->tail_len;
    uVar13 = right - uVar10;
    uVar14 = (ulong)uVar13;
    if (right < uVar10 || uVar13 == 0) {
      puVar11 = (undefined8 *)malloc(0x28);
      *puVar11 = 0;
      *(undefined4 *)(puVar11 + 1) = 0;
      puVar11[2] = 0;
      puVar11[3] = 0;
      local_40.ptr = (leaf_node<char,_false> *)malloc(0x18);
      (local_40.ptr)->child = (char *)0x0;
      (local_40.ptr)->type = LEAF_NODE;
      (local_40.ptr)->len = 0;
      (local_40.ptr)->_ref_count = 1;
      (local_40.ptr)->guid = 0;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar11 + 2),&local_40);
      if ((local_40.ptr != (leaf_node<char,_false> *)0x0) &&
         (uVar2 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_40.ptr);
      }
      *(undefined8 **)this = puVar11;
      *(undefined4 *)(puVar11 + 4) = 1;
      prVar3 = in->ptr;
      if (prVar3 != (rrb<char,_false,_5> *)0x0) {
        rrb_drop_right_rec<char,false,5>
                  ((rrb_details *)&local_38,(uint32_t *)((long)puVar11 + 4),&prVar3->root,right - 1,
                   prVar3->shift,false);
        puVar5 = *(uint32_t **)this;
        if (puVar5 != (uint32_t *)0x0) {
          *puVar5 = right;
          if (local_38.ptr != (tree_node<char,_false> *)0x0) {
            (local_38.ptr)->_ref_count = (local_38.ptr)->_ref_count + 1;
          }
          local_40.ptr = *(leaf_node<char,_false> **)(puVar5 + 6);
          *(tree_node<char,_false> **)(puVar5 + 6) = local_38.ptr;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_40);
          promote_rightmost_leaf<char,false,5>((ref<immutable::rrb<char,_false,_5>_> *)this);
          lVar6 = *(long *)this;
          if (lVar6 != 0) {
            if (*(long *)(lVar6 + 0x10) != 0) {
              *(undefined4 *)(lVar6 + 8) = *(undefined4 *)(*(long *)(lVar6 + 0x10) + 4);
              ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
              return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
            }
LAB_001423f6:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
            ;
            goto LAB_0014240b;
          }
        }
      }
    }
    else {
      puVar11 = (undefined8 *)malloc(0x28);
      uVar7 = *(undefined8 *)prVar3;
      uVar8 = *(undefined8 *)&prVar3->tail_len;
      ptVar9 = (prVar3->root).ptr;
      puVar11[2] = (prVar3->tail).ptr;
      puVar11[3] = ptVar9;
      *puVar11 = uVar7;
      puVar11[1] = uVar8;
      puVar11[4] = *(undefined8 *)&prVar3->_ref_count;
      if (puVar11[3] != 0) {
        piVar1 = (int *)(puVar11[3] + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (puVar11[2] != 0) {
        piVar1 = (int *)(puVar11[2] + 8);
        *piVar1 = *piVar1 + 1;
      }
      *(undefined8 **)this = puVar11;
      *(undefined4 *)(puVar11 + 4) = 1;
      local_40.ptr = (leaf_node<char,_false> *)malloc(uVar14 + 0x18);
      (local_40.ptr)->len = uVar13;
      uVar12 = 0;
      (local_40.ptr)->type = LEAF_NODE;
      (local_40.ptr)->child = (char *)(local_40.ptr + 1);
      (local_40.ptr)->guid = 0;
      do {
        (local_40.ptr)->child[uVar12] = '\0';
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
      (local_40.ptr)->_ref_count = 1;
      uVar12 = 0;
      do {
        if (in->ptr == (rrb<char,_false,_5> *)0x0) goto LAB_001423df;
        plVar4 = (in->ptr->tail).ptr;
        if (plVar4 == (leaf_node<char,_false> *)0x0) goto LAB_001423f6;
        (local_40.ptr)->child[uVar12] = plVar4->child[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
      puVar5 = *(uint32_t **)this;
      if (puVar5 != (uint32_t *)0x0) {
        *puVar5 = right;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar5 + 4),&local_40);
        if (*(long *)this != 0) {
          *(uint *)(*(long *)this + 8) = uVar13;
          if (local_40.ptr == (leaf_node<char,_false> *)0x0) {
            return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
          }
          uVar2 = (local_40.ptr)->_ref_count;
          (local_40.ptr)->_ref_count = uVar2 - 1;
          if (uVar2 != 1) {
            return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
          }
          free(local_40.ptr);
          return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
        }
      }
    }
  }
LAB_001423df:
  __function = 
  "T *immutable::ref<immutable::rrb<char, false>>::operator->() const [T = immutable::rrb<char, false>]"
  ;
LAB_0014240b:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }